

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

void __thiscall
Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>>::
parse<Fixpp::impl::TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)70>,Fixpp::Required<Fixpp::TagT<41u,Fixpp::Type::String>>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<1u,Fixpp::Type::String>,Fixpp::TagT<109u,Fixpp::Type::String>,Fixpp::TagT<76u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<38u,Fixpp::Type::Float>,Fixpp::TagT<152u,Fixpp::Type::Float>,Fixpp::TagT<376u,Fixpp::Type::String>,Fixpp::TagT<377u,Fixpp::Type::Boolean>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>> *this,
          Field *field,ParsingContext *context,
          TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_F_>,_Fixpp::Required<Fixpp::TagT<41U,_Fixpp::Type::String>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<38U,_Fixpp::Type::Float>,_Fixpp::TagT<152U,_Fixpp::Type::Float>,_Fixpp::TagT<376U,_Fixpp::Type::String>,_Fixpp::TagT<377U,_Fixpp::Type::Boolean>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
          *tagSet,bool param_4,bool param_5)

{
  StreamCursor *cursor;
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  char *pcVar5;
  Type type;
  
  cursor = context->cursor;
  lVar1 = *(long *)&cursor->buf->field_0x8;
  pcVar5 = *(char **)&cursor->buf->field_0x10;
  bVar4 = match_until_fast('|',cursor);
  if (bVar4) {
    lVar2 = *(long *)&cursor->buf->field_0x8;
    lVar3 = *(long *)&cursor->buf->field_0x10;
    bVar4 = StreamCursor::advance(cursor,1);
    if (bVar4) {
      (field->m_view).first = pcVar5;
      (field->m_view).second = (lVar1 + lVar3) - (long)(pcVar5 + lVar2);
      TagSet<Fixpp::Required<Fixpp::TagT<41U,_Fixpp::Type::String>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<38U,_Fixpp::Type::Float>,_Fixpp::TagT<152U,_Fixpp::Type::Float>,_Fixpp::TagT<376U,_Fixpp::Type::String>,_Fixpp::TagT<377U,_Fixpp::Type::Boolean>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
      ::set(&tagSet->
             super_TagSet<Fixpp::Required<Fixpp::TagT<41U,_Fixpp::Type::String>_>,_Fixpp::TagT<37U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<1U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<38U,_Fixpp::Type::Float>,_Fixpp::TagT<152U,_Fixpp::Type::Float>,_Fixpp::TagT<376U,_Fixpp::Type::String>,_Fixpp::TagT<377U,_Fixpp::Type::Boolean>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
            ,0x3c);
      return;
    }
    pcVar5 = "Expected value after tag \'%d\', got EOF";
    type = Incomplete;
  }
  else {
    pcVar5 = "Expected value tag \'%d\', got EOF";
    type = ParsingError;
  }
  ParsingContext::setError(context,type,pcVar5,0x3c);
  return;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool /* strict */, bool /* skipUnknown */)
            {
                auto& cursor = context.cursor;
                // @Todo: In Strict mode, validate the type of the Tag
                StreamCursor::Token valueToken(context.cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value tag '%d', got EOF", TagT::Id);

                auto view = valueToken.view();
                TRY_ADVANCE("Expected value after tag '%d', got EOF", TagT::Id);

                field.set(view);
                tagSet.set(field.tag());
            }